

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::icu_calendar_facet::icu_calendar_facet
          (icu_calendar_facet *this,cdata *d,size_t refs)

{
  cdata *in_RDX;
  cdata *in_RSI;
  calendar_facet *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  
  calendar_facet::calendar_facet(in_RDI,in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__icu_calendar_facet_002eac58;
  cdata::cdata(in_RSI,in_RDX);
  return;
}

Assistant:

icu_calendar_facet(cdata const &d,size_t refs = 0) : 
            calendar_facet(refs),
            data_(d)
        {
        }